

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

void __thiscall wabt::AST::Construct(AST *this,Expr *e)

{
  LabelType LVar1;
  ModuleContext *pMVar2;
  bool bVar3;
  ExprType EVar4;
  Index IVar5;
  Index IVar6;
  VarExpr<(wabt::ExprType)24> *ve;
  VarExpr<(wabt::ExprType)20> *ve_00;
  VarExpr<(wabt::ExprType)25> *ve_01;
  VarExpr<(wabt::ExprType)21> *ve_02;
  VarExpr<(wabt::ExprType)26> *ve_03;
  IfExpr *pIVar7;
  BlockExprBase<(wabt::ExprType)8> *be;
  BlockExprBase<(wabt::ExprType)27> *be_00;
  VarExpr<(wabt::ExprType)9> *pVVar8;
  VarExpr<(wabt::ExprType)10> *pVVar9;
  BrTableExpr *pBVar10;
  Label *pLVar11;
  Node *pNVar12;
  Arities AVar13;
  IfExpr *ife;
  VarExpr<(wabt::ExprType)26> *lt;
  Index local_28;
  Arities arity;
  Expr *e_local;
  AST *this_local;
  
  AVar13 = ModuleContext::GetExprArity(this->mc,e);
  EVar4 = Expr::type(e);
  switch(EVar4) {
  case Block:
    be = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(e);
    Block<(wabt::ExprType)8>(this,be,Block);
    break;
  case Br:
    pMVar2 = this->mc;
    pVVar8 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(e);
    pLVar11 = ModuleContext::GetLabel(pMVar2,&pVVar8->var);
    LVar1 = pLVar11->label_type;
    pNVar12 = InsertNode(this,Expr,Br,e,0);
    (pNVar12->u).field_0.var_start = LVar1;
    break;
  case BrIf:
    pMVar2 = this->mc;
    pVVar9 = cast<wabt::VarExpr<(wabt::ExprType)10>,wabt::Expr>(e);
    pLVar11 = ModuleContext::GetLabel(pMVar2,&pVVar9->var);
    LVar1 = pLVar11->label_type;
    pNVar12 = InsertNode(this,Expr,BrIf,e,1);
    (pNVar12->u).field_0.var_start = LVar1;
    break;
  case BrTable:
    pMVar2 = this->mc;
    pBVar10 = cast<wabt::BrTableExpr,wabt::Expr>(e);
    pLVar11 = ModuleContext::GetLabel(pMVar2,&pBVar10->default_target);
    LVar1 = pLVar11->label_type;
    pNVar12 = InsertNode(this,Expr,BrTable,e,1);
    (pNVar12->u).field_0.var_start = LVar1;
    break;
  default:
    EVar4 = Expr::type(e);
    local_28 = AVar13.nargs;
    InsertNode(this,Expr,EVar4,e,local_28);
    break;
  case GlobalGet:
    ve_00 = cast<wabt::VarExpr<(wabt::ExprType)20>,wabt::Expr>(e);
    Get<(wabt::ExprType)20>(this,ve_00,false);
    break;
  case GlobalSet:
    ve_02 = cast<wabt::VarExpr<(wabt::ExprType)21>,wabt::Expr>(e);
    Set<(wabt::ExprType)21>(this,ve_02,false);
    break;
  case If:
    pIVar7 = cast<wabt::IfExpr,wabt::Expr>(e);
    this->value_stack_depth = this->value_stack_depth + -1;
    ModuleContext::BeginBlock(this->mc,Block,&pIVar7->true_);
    IVar5 = FuncDeclaration::GetNumResults(&(pIVar7->true_).decl);
    IVar6 = FuncDeclaration::GetNumParams(&(pIVar7->true_).decl);
    Construct(this,&(pIVar7->true_).exprs,IVar5,IVar6,false);
    bVar3 = intrusive_list<wabt::Expr>::empty(&pIVar7->false_);
    if (!bVar3) {
      IVar5 = FuncDeclaration::GetNumResults(&(pIVar7->true_).decl);
      IVar6 = FuncDeclaration::GetNumParams(&(pIVar7->true_).decl);
      Construct(this,&pIVar7->false_,IVar5,IVar6,false);
    }
    ModuleContext::EndBlock(this->mc);
    this->value_stack_depth = this->value_stack_depth + 1;
    bVar3 = intrusive_list<wabt::Expr>::empty(&pIVar7->false_);
    IVar5 = 3;
    if (bVar3) {
      IVar5 = 2;
    }
    InsertNode(this,Expr,If,e,IVar5);
    break;
  case LocalGet:
    ve = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(e);
    Get<(wabt::ExprType)24>(this,ve,true);
    break;
  case LocalSet:
    ve_01 = cast<wabt::VarExpr<(wabt::ExprType)25>,wabt::Expr>(e);
    Set<(wabt::ExprType)25>(this,ve_01,true);
    break;
  case LocalTee:
    ve_03 = cast<wabt::VarExpr<(wabt::ExprType)26>,wabt::Expr>(e);
    Set<(wabt::ExprType)26>(this,ve_03,true);
    if (this->value_stack_depth == 1) {
      Get<(wabt::ExprType)26>(this,ve_03,true);
    }
    break;
  case Loop:
    be_00 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(e);
    Block<(wabt::ExprType)27>(this,be_00,Loop);
  }
  return;
}

Assistant:

void Construct(const Expr& e) {
    auto arity = mc.GetExprArity(e);
    switch (e.type()) {
      case ExprType::LocalGet: {
        Get(*cast<LocalGetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalGet: {
        Get(*cast<GlobalGetExpr>(&e), false);
        return;
      }
      case ExprType::LocalSet: {
        Set(*cast<LocalSetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalSet: {
        Set(*cast<GlobalSetExpr>(&e), false);
        return;
      }
      case ExprType::LocalTee: {
        auto& lt = *cast<LocalTeeExpr>(&e);
        Set(lt, true);
        if (value_stack_depth == 1) {  // Tee is the only thing on there.
          Get(lt, true);               // Now Set + Get instead.
        } else {
          // Things are above us on the stack so the Tee can't be eliminated.
          // The Set makes this work as a Tee when consumed by a parent.
        }
        return;
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(&e);
        value_stack_depth--;  // Condition.
        mc.BeginBlock(LabelType::Block, ife->true_);
        Construct(ife->true_.exprs, ife->true_.decl.GetNumResults(),
                  ife->true_.decl.GetNumParams(), false);
        if (!ife->false_.empty()) {
          Construct(ife->false_, ife->true_.decl.GetNumResults(),
                    ife->true_.decl.GetNumParams(), false);
        }
        mc.EndBlock();
        value_stack_depth++;  // Put Condition back.
        InsertNode(NodeType::Expr, ExprType::If, &e,
                   ife->false_.empty() ? 2 : 3);
        return;
      }
      case ExprType::Block: {
        Block(*cast<BlockExpr>(&e), LabelType::Block);
        return;
      }
      case ExprType::Loop: {
        Block(*cast<LoopExpr>(&e), LabelType::Loop);
        return;
      }
      case ExprType::Br: {
        InsertNode(NodeType::Expr, ExprType::Br, &e, 0).u.lt =
            mc.GetLabel(cast<BrExpr>(&e)->var)->label_type;
        return;
      }
      case ExprType::BrIf: {
        InsertNode(NodeType::Expr, ExprType::BrIf, &e, 1).u.lt =
            mc.GetLabel(cast<BrIfExpr>(&e)->var)->label_type;
        return;
      }
      case ExprType::BrTable: {
        InsertNode(NodeType::Expr, ExprType::BrTable, &e, 1).u.lt =
            mc.GetLabel(cast<BrTableExpr>(&e)->default_target)->label_type;
        return;
      }
      default: {
        InsertNode(NodeType::Expr, e.type(), &e, arity.nargs);
        return;
      }
    }
  }